

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
          (value_type *__return_storage_ptr__,
          FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadFuncLog<Fad<double>_>_> local_b0;
  FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> local_88;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_78;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> local_68;
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_> local_58;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  local_48;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>_>_>
  local_38;
  
  pFVar1 = (this->right_->dx_).ptr_to_data;
  log<double>(&local_b0,&this->left_->val_);
  local_48.fadexpr_.left_ = &local_58;
  local_88.fadexpr_.right_ = &this->right_->val_;
  local_78.fadexpr_.right_ = (this->left_->dx_).ptr_to_data + i;
  local_68.fadexpr_.left_ = &local_78;
  local_88.fadexpr_.left_ = &this->left_->val_;
  local_48.fadexpr_.right_ = &local_68;
  local_38.fadexpr_.left_ = &local_48;
  local_38.fadexpr_.right_ = &local_88;
  local_78.fadexpr_.left_ = local_88.fadexpr_.right_;
  local_68.fadexpr_.right_ = local_88.fadexpr_.left_;
  local_58.fadexpr_.left_ = pFVar1 + i;
  local_58.fadexpr_.right_ = &local_b0;
  Fad<double>::
  Fad<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadFuncLog<Fad<double>>>>>,FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryPow<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_b0.fadexpr_.expr_);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const 
    {
      return  (right_.fastAccessDx(i)*log(left_.val())+right_.val()*left_.fastAccessDx(i)/left_.val())
	*pow( left_.val(), right_.val() );
    }